

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
          (PortalImageInfiniteLight *this,Transform *renderFromLight,Image *equalAreaImage,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,Allocator alloc)

{
  Image *pIVar1;
  float fVar2;
  undefined8 uVar3;
  uint uVar4;
  pointer pcVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  pointer pPVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  int iVar28;
  memory_resource *pmVar29;
  undefined4 extraout_var;
  allocator_type allocator;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar30;
  uint uVar31;
  long *plVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  long in_FS_OFFSET;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  float local_278;
  size_t vb;
  undefined4 uStack_250;
  undefined1 auStack_248 [16];
  undefined1 local_238 [32];
  long *local_218 [2];
  long local_208;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_200;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1e0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  string *local_180;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_178;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *local_170;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_160;
  Transform *local_158;
  PortalImageInfiniteLight *local_150;
  int va;
  int iStack_144;
  Tuple2<pbrt::Point2,_int> local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  long *local_108 [2];
  long local_f8 [2];
  undefined1 local_e8 [16];
  undefined8 *local_d8;
  undefined8 uStack_d0;
  code *pcStack_c8;
  code *pcStack_c0;
  ImageChannelDesc channelDesc;
  Array2D<float> local_68;
  undefined1 local_48 [16];
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  (this->super_LightBase).type = Infinite;
  pIVar1 = &this->image;
  uVar3 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar14 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar15 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar16 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar17 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar18 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar19 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  uVar20 = *(undefined8 *)(renderFromLight->m).m[0];
  uVar21 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar22 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar23 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar24 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar25 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar26 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar27 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] =
       *(undefined8 *)(renderFromLight->mInv).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar3;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar14;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar15;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar16;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar17;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar18;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar19;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] = uVar20;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar21;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar22;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar23;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar24;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar25;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar26;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar27;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  *(long *)(in_FS_OFFSET + -0x470) = *(long *)(in_FS_OFFSET + -0x470) + 1;
  *(undefined1 (*) [32])&(this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y =
       ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])(this->portal).values = ZEXT432(0) << 0x40;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  (this->image).format = U256;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  local_158 = renderFromLight;
  pmVar29 = pstd::pmr::new_delete_resource();
  (this->image).channelNames.alloc.memoryResource = pmVar29;
  (this->image).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->image).channelNames.nAlloc = 0;
  (this->image).channelNames.nStored = 0;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  auVar41 = ZEXT416(0) << 0x40;
  (this->image).p8.alloc.memoryResource = alloc.memoryResource;
  (this->image).p8.nStored = 0;
  (this->image).p8.ptr = (uchar *)auVar41._0_8_;
  (this->image).p8.nAlloc = auVar41._8_8_;
  (this->image).p16.alloc.memoryResource = alloc.memoryResource;
  (this->image).p16.ptr = (Half *)auVar41._0_8_;
  (this->image).p16.nAlloc = auVar41._8_8_;
  (this->image).p16.nStored = 0;
  (this->image).p32.alloc.memoryResource = alloc.memoryResource;
  (this->image).p32.ptr = (float *)auVar41._0_8_;
  (this->image).p32.nAlloc = auVar41._8_8_;
  (this->image).p32.nStored = 0;
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D(&this->distribution,alloc);
  this->imageColorSpace = imageColorSpace;
  this->scale = scale;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar5 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar5,pcVar5 + filename->_M_string_length);
  vb = (size_t)auStack_248;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_180 = &this->filename;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"R","");
  local_238._0_8_ = (long)local_238 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"G","");
  plVar32 = &local_208;
  local_218[0] = plVar32;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"B","");
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&channelDesc,equalAreaImage,requestedChannels);
  local_168 = &(this->image).p8;
  local_160 = &(this->image).channelNames;
  local_170 = &(this->image).p16;
  lVar35 = -0x60;
  local_178 = &(this->image).p32;
  do {
    if (plVar32 != (long *)plVar32[-2]) {
      operator_delete((long *)plVar32[-2],*plVar32 + 1);
    }
    plVar32 = plVar32 + -4;
    lVar35 = lVar35 + 0x20;
  } while (lVar35 != 0);
  if (channelDesc.offset.nStored == 0) {
    ErrorExit<std::__cxx11::string_const&>
              ("%s: image used for PortalImageInfiniteLight doesn\'t have R, G, B channels.",
               filename);
  }
  va = 3;
  vb = channelDesc.offset.nStored;
  if (channelDesc.offset.nStored != 3) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
               ,0x40a,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x558341,
               (char (*) [19])"channelDesc.size()",(char (*) [2])0x558341,&va,
               (char (*) [19])"channelDesc.size()",(unsigned_long *)&vb);
  }
  paVar30 = &channelDesc.offset.field_2;
  if (channelDesc.offset.ptr != (int *)0x0) {
    paVar30 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
               *)channelDesc.offset.ptr;
  }
  if (paVar30->fixed[0] != 0) {
LAB_00350d6e:
    LogFatal<char_const(&)[25]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
               ,0x40b,"Check failed: %s",(char (*) [25])"channelDesc.IsIdentity()");
  }
  paVar30 = &channelDesc.offset.field_2;
  if (channelDesc.offset.ptr != (int *)0x0) {
    paVar30 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
               *)channelDesc.offset.ptr;
  }
  if (paVar30->fixed[1] != 1) goto LAB_00350d6e;
  paVar30 = &channelDesc.offset.field_2;
  if (channelDesc.offset.ptr != (int *)0x0) {
    paVar30 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
               *)channelDesc.offset.ptr;
  }
  if (paVar30->fixed[2] != 2) goto LAB_00350d6e;
  TVar6 = (equalAreaImage->resolution).super_Tuple2<pbrt::Point2,_int>;
  if (TVar6.x != TVar6.y) {
    vb = (size_t)TVar6;
    _va = TVar6;
    ErrorExit<std::__cxx11::string_const&,int,int>
              ("%s: image resolution (%d, %d) is non-square. It\'s unlikely this is an equal area environment map."
               ,filename,(int *)&vb,&iStack_144);
  }
  lVar35 = (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar35 != 0x30) {
    vb = (lVar35 >> 2) * -0x5555555555555555;
    ErrorExit<unsigned_long>("Expected 4 vertices for infinite light portal but given %d",&vb);
  }
  lVar35 = 0;
  do {
    pPVar7 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z + lVar35) =
         *(undefined4 *)((long)&(pPVar7->super_Tuple3<pbrt::Point3,_float>).z + lVar35);
    *(undefined8 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar35) =
         *(undefined8 *)((long)&(pPVar7->super_Tuple3<pbrt::Point3,_float>).x + lVar35);
    lVar35 = lVar35 + 0xc;
  } while (lVar35 != 0x30);
  uVar33._0_4_ = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.x;
  uVar33._4_4_ = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.y;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar33;
  fVar50 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.x;
  fVar56 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y;
  fVar55 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.z;
  fVar2 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.z;
  fVar49 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.z;
  auVar39 = vmovshdup_avx(auVar37);
  fVar54 = (float)(undefined4)uVar33 - fVar50;
  fVar8 = fVar2 - fVar55;
  fVar2 = fVar2 - fVar49;
  auVar41 = vinsertps_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar49),0x10);
  fVar55 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
  auVar40._4_4_ = fVar55;
  auVar40._0_4_ = fVar55;
  auVar40._8_4_ = fVar55;
  auVar40._12_4_ = fVar55;
  auVar36 = vsubps_avx512vl(auVar41,auVar40);
  fVar55 = auVar39._0_4_ - fVar56;
  auVar41 = ZEXT416((uint)(fVar54 * fVar54 + fVar55 * fVar55 + fVar8 * fVar8));
  auVar41 = vsqrtss_avx(auVar41,auVar41);
  fVar49 = auVar41._0_4_;
  fVar55 = fVar55 / fVar49;
  auVar53 = ZEXT416((uint)(fVar8 / fVar49));
  uVar34._0_4_ = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.x;
  uVar34._4_4_ = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar34;
  fVar54 = fVar54 / fVar49;
  auVar40 = vsubps_avx(auVar37,auVar48);
  auVar39._4_4_ = uVar34._4_4_;
  auVar39._0_4_ = fVar56;
  auVar39._8_8_ = 0;
  fVar56 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar41._4_4_ = fVar56;
  auVar41._0_4_ = fVar56;
  auVar41._8_4_ = fVar56;
  auVar41._12_4_ = fVar56;
  auVar37 = vsubps_avx512vl(auVar39,auVar41);
  fVar56 = auVar40._0_4_;
  auVar51._0_4_ = fVar56 * fVar56;
  auVar51._4_4_ = auVar40._4_4_ * auVar40._4_4_;
  auVar51._8_4_ = auVar40._8_4_ * auVar40._8_4_;
  auVar51._12_4_ = auVar40._12_4_ * auVar40._12_4_;
  auVar41 = vhaddps_avx(auVar51,auVar51);
  auVar41 = ZEXT416((uint)(fVar2 * fVar2 + auVar41._0_4_));
  auVar39 = vsqrtss_avx(auVar41,auVar41);
  auVar41 = vinsertps_avx(ZEXT416((uint)fVar50),auVar48,0x1c);
  fVar50 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar38._4_4_ = fVar50;
  auVar38._0_4_ = fVar50;
  auVar38._8_4_ = fVar50;
  auVar38._12_4_ = fVar50;
  auVar38 = vsubps_avx512vl(auVar41,auVar38);
  fVar50 = auVar39._0_4_;
  auVar52._0_4_ = fVar56 / fVar50;
  auVar52._4_12_ = auVar40._4_12_;
  auVar41 = vmovshdup_avx(auVar40);
  fVar56 = auVar41._0_4_ / fVar50;
  auVar48 = ZEXT416((uint)(fVar2 / fVar50));
  auVar47._0_4_ =
       auVar38._0_4_ * auVar38._0_4_ + auVar37._0_4_ * auVar37._0_4_ + auVar36._0_4_ * auVar36._0_4_
  ;
  auVar47._4_4_ =
       auVar38._4_4_ * auVar38._4_4_ + auVar37._4_4_ * auVar37._4_4_ + auVar36._4_4_ * auVar36._4_4_
  ;
  auVar47._8_4_ =
       auVar38._8_4_ * auVar38._8_4_ + auVar37._8_4_ * auVar37._8_4_ + auVar36._8_4_ * auVar36._8_4_
  ;
  auVar47._12_4_ =
       auVar38._12_4_ * auVar38._12_4_ + auVar37._12_4_ * auVar37._12_4_ +
       auVar36._12_4_ * auVar36._12_4_;
  auVar41 = vblendps_avx(auVar37,auVar38,2);
  auVar38 = vpermt2ps_avx512vl(auVar38,_DAT_0054e650,auVar37);
  auVar40 = vsqrtps_avx(auVar47);
  auVar39 = vshufps_avx(auVar40,auVar40,0xe1);
  local_198 = vdivps_avx(auVar41,auVar40);
  local_e8 = vdivps_avx(auVar36,auVar40);
  local_1a8 = vdivps_avx(auVar38,auVar39);
  auVar41 = vmovshdup_avx(local_1a8);
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar56 * local_198._0_4_)),auVar41,auVar52);
  auVar39 = vfmadd231ss_fma(auVar39,local_e8,auVar48);
  auVar36._8_4_ = 0x7fffffff;
  auVar36._0_8_ = 0x7fffffff7fffffff;
  auVar36._12_4_ = 0x7fffffff;
  auVar39 = vandps_avx512vl(ZEXT416((uint)(auVar39._0_4_ + -1.0)),auVar36);
  local_1b8 = vmovshdup_avx(local_198);
  if (0.001 < auVar39._0_4_) {
LAB_00350692:
    _uStack_250 = 0;
    auStack_248._0_8_ = auStack_248._0_8_ & 0xffffffffffffff00;
    vb = (size_t)auStack_248;
    detail::stringPrintfRecursive
              ((string *)&vb,"Infinite light portal isn\'t a planar quadrilateral");
    Error((FileLoc *)0x0,(char *)vb);
    if ((undefined1 *)vb != auStack_248) {
      operator_delete((void *)vb,auStack_248._0_8_ + 1);
    }
    auVar52 = ZEXT416((uint)auVar52._0_4_);
  }
  else {
    auVar39 = vmovshdup_avx(local_e8);
    auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar55 * (float)local_1a8._0_4_)),ZEXT416((uint)fVar54)
                              ,ZEXT416((uint)local_1b8._0_4_));
    auVar39 = vfmadd213ss_fma(auVar39,auVar53,auVar40);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx512vl(ZEXT416((uint)(auVar39._0_4_ + -1.0)),auVar9);
    if (0.001 < auVar39._0_4_) goto LAB_00350692;
  }
  local_278 = auVar41._0_4_;
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar55 * (float)local_198._0_4_)),ZEXT416((uint)fVar54),
                            ZEXT416((uint)local_278));
  auVar39 = vfmadd231ss_fma(auVar39,local_e8,auVar53);
  auVar10._8_4_ = 0x7fffffff;
  auVar10._0_8_ = 0x7fffffff7fffffff;
  auVar10._12_4_ = 0x7fffffff;
  auVar39 = vandps_avx512vl(auVar39,auVar10);
  if (auVar39._0_4_ <= 0.001) {
    auVar39 = vfmadd213ss_fma(ZEXT416((uint)fVar54),auVar52,ZEXT416((uint)(fVar55 * fVar56)));
    auVar39 = vfmadd213ss_fma(auVar53,auVar48,auVar39);
    auVar53._8_4_ = 0x7fffffff;
    auVar53._0_8_ = 0x7fffffff7fffffff;
    auVar53._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx512vl(auVar39,auVar53);
    if (auVar39._0_4_ <= 0.001) {
      auVar40 = vfmadd132ss_fma(auVar52,ZEXT416((uint)(fVar56 * (float)local_1a8._0_4_)),
                                ZEXT416((uint)local_1b8._0_4_));
      auVar39 = vmovshdup_avx(local_e8);
      auVar40 = vfmadd213ss_fma(auVar48,auVar39,auVar40);
      auVar11._8_4_ = 0x7fffffff;
      auVar11._0_8_ = 0x7fffffff7fffffff;
      auVar11._12_4_ = 0x7fffffff;
      auVar40 = vandps_avx512vl(auVar40,auVar11);
      if (auVar40._0_4_ <= 0.001) {
        auVar40 = vfmadd231ss_fma(ZEXT416((uint)((float)local_198._0_4_ * (float)local_1a8._0_4_)),
                                  local_1b8,ZEXT416((uint)local_278));
        auVar39 = vfmadd231ss_fma(auVar40,local_e8,auVar39);
        auVar12._8_4_ = 0x7fffffff;
        auVar12._0_8_ = 0x7fffffff7fffffff;
        auVar12._12_4_ = 0x7fffffff;
        auVar39 = vandps_avx512vl(auVar39,auVar12);
        if (auVar39._0_4_ <= 0.001) goto LAB_00350849;
      }
    }
  }
  _uStack_250 = 0;
  auStack_248._0_8_ = auStack_248._0_8_ & 0xffffffffffffff00;
  vb = (size_t)auStack_248;
  detail::stringPrintfRecursive((string *)&vb,"Infinite light portal isn\'t a planar quadrilateral")
  ;
  Error((FileLoc *)0x0,(char *)vb);
  if ((undefined1 *)vb != auStack_248) {
    operator_delete((void *)vb,auStack_248._0_8_ + 1);
  }
LAB_00350849:
  auVar39 = vshufps_avx(local_e8,local_e8,0xe1);
  auVar43._0_4_ = local_198._0_4_ * auVar39._0_4_;
  auVar43._4_4_ = local_198._4_4_ * auVar39._4_4_;
  auVar43._8_4_ = local_198._8_4_ * auVar39._8_4_;
  auVar43._12_4_ = local_198._12_4_ * auVar39._12_4_;
  auVar39 = vinsertps_avx(local_198,local_e8,0x4c);
  auVar40 = vinsertps_avx(local_198,local_e8,0x1c);
  auVar36 = vpermt2ps_avx512vl(local_198,_DAT_0054e650,local_1a8);
  auVar37 = vpermi2ps_avx512vl(_DAT_0054e650,local_1a8,local_198);
  auVar38 = vfmsub213ps_fma(local_1a8,local_e8,auVar43);
  auVar39 = vfnmadd213ps_fma(auVar40,auVar39,auVar43);
  uVar3 = vmovlps_avx(auVar37);
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  fVar50 = (float)vextractps_avx(local_e8,1);
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = fVar50;
  uVar3 = vmovlps_avx(auVar36);
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = local_e8._0_4_;
  auVar44._0_4_ = auVar38._0_4_ + auVar39._0_4_;
  auVar44._4_4_ = auVar38._4_4_ + auVar39._4_4_;
  auVar44._8_4_ = auVar38._8_4_ + auVar39._8_4_;
  auVar44._12_4_ = auVar38._12_4_ + auVar39._12_4_;
  uVar3 = vmovlps_avx(auVar44);
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  auVar40 = ZEXT416((uint)(local_278 * local_1a8._0_4_));
  auVar39 = vfmsub213ss_fma(local_1b8,local_198,auVar40);
  auVar41 = vfnmadd213ss_fma(auVar41,local_1a8,auVar40);
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = auVar39._0_4_ + auVar41._0_4_;
  TVar6 = (equalAreaImage->resolution).super_Tuple2<pbrt::Point2,_int>;
  _va = (Tuple2<pbrt::Point2,_int>)&local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&va,"R","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"G","");
  plVar32 = local_f8;
  local_108[0] = plVar32;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"B","");
  local_38.bits =
       (equalAreaImage->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&va;
  Image::Image((Image *)&vb,Float,(Point2i)TVar6,channels,(ColorEncodingHandle *)&local_38,alloc);
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y = uStack_250;
  pIVar1->format = (undefined4)vb;
  (pIVar1->resolution).super_Tuple2<pbrt::Point2,_int>.x = vb._4_4_;
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(local_160,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_248);
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = local_238._16_8_;
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
            (local_168,
             (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
             (local_238 + 0x18));
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
            (local_170,&local_200);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(local_178,&local_1e0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_1e0);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_200);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
             (local_238 + 0x18));
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_248);
  lVar35 = -0x60;
  do {
    if (plVar32 != (long *)plVar32[-2]) {
      operator_delete((long *)plVar32[-2],*plVar32 + 1);
    }
    plVar32 = plVar32 + -4;
    lVar35 = lVar35 + 0x20;
  } while (lVar35 != 0);
  TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_d8 = (undefined8 *)0x0;
  uStack_d0 = 0;
  pcStack_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8 = (undefined8 *)operator_new(0x18);
  *local_d8 = this;
  vb = (size_t)&local_d8;
  pcStack_c0 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp:1065:42)>
               ::_M_invoke;
  local_d8[1] = local_158;
  local_d8[2] = equalAreaImage;
  pcStack_c8 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp:1065:42)>
               ::_M_manager;
  _uStack_250 = 0;
  auStack_248._8_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
       ::_M_invoke;
  auStack_248._0_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
       ::_M_manager;
  ParallelFor(0,(long)TVar6 >> 0x20,(function<void_(long,_long)> *)&vb);
  if ((code *)auStack_248._0_8_ != (code *)0x0) {
    (*(code *)auStack_248._0_8_)(&vb,&vb,3);
  }
  if (pcStack_c8 != (code *)0x0) {
    (*pcStack_c8)(&local_d8,&local_d8,3);
  }
  auVar45._8_4_ = 0x3f800000;
  auVar45._0_8_ = 0x3f8000003f800000;
  auVar45._12_4_ = 0x3f800000;
  local_48 = vmovlhps_avx(ZEXT816(0) << 0x40,auVar45);
  local_138._M_allocated_capacity = (size_type)pstd::pmr::new_delete_resource();
  uVar33 = 0;
  uVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y;
  uVar31 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x;
  uVar34 = 0;
  if (0 < (int)uVar31) {
    uVar34 = (ulong)uVar31;
  }
  if (0 < (int)uVar4) {
    uVar33 = (ulong)uVar4;
  }
  _va = (Tuple2<pbrt::Point2,_int>)CONCAT44((int)uVar4 >> 0x1f & uVar4,(int)uVar31 >> 0x1f & uVar31)
  ;
  local_140 = (Tuple2<pbrt::Point2,_int>)(uVar34 | uVar33 << 0x20);
  uVar13 = -uVar31;
  if (0 < (int)uVar31) {
    uVar13 = uVar31;
  }
  uVar31 = -uVar4;
  if (0 < (int)uVar4) {
    uVar31 = uVar4;
  }
  uVar31 = uVar31 * uVar13;
  local_150 = this;
  if (uVar31 == 0) {
    local_138._8_8_ = (float *)0x0;
  }
  else {
    iVar28 = (*((memory_resource *)local_138._M_allocated_capacity)->_vptr_memory_resource[2])
                       (local_138._M_allocated_capacity,(ulong)uVar31 * 4,4);
    local_138._8_8_ = CONCAT44(extraout_var,iVar28);
    memset((void *)local_138._8_8_,0,(ulong)uVar31 << 2);
  }
  iVar28 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y;
  vb = 0;
  _uStack_250 = 0;
  auStack_248._0_8_ = 0;
  auStack_248._8_8_ = 0;
  vb = (size_t)operator_new(0x20);
  *(Image **)vb = pIVar1;
  *(undefined1 **)(vb + 8) = local_48;
  *(int **)(vb + 0x10) = &va;
  *(PortalImageInfiniteLight ***)(vb + 0x18) = &local_150;
  auStack_248._8_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h:445:35)>
       ::_M_invoke;
  auStack_248._0_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h:445:35)>
       ::_M_manager;
  ParallelFor(0,(long)iVar28,(function<void_(long,_long)> *)&vb);
  if ((code *)auStack_248._0_8_ != (code *)0x0) {
    (*(code *)auStack_248._0_8_)(&vb,&vb,3);
  }
  allocator.memoryResource = pstd::pmr::new_delete_resource();
  auVar42._8_8_ = 0;
  auVar42._0_4_ = local_140.x;
  auVar42._4_4_ = local_140.y;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = _va;
  auVar41 = vpsubd_avx(auVar42,auVar46);
  Array2D<float>::Array2D<float_const*,void>
            (&local_68,(float *)local_138._8_8_,
             (float *)(local_138._8_8_ + (long)(auVar41._4_4_ * auVar41._0_4_) * 4),auVar41._0_4_,
             auVar41._4_4_,allocator);
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
            ((WindowedPiecewiseConstant2D *)&vb,&local_68,alloc);
  Array2D<double>::operator=((Array2D<double> *)&this->distribution,(Array2D<double> *)&vb);
  Array2D<float>::operator=(&(this->distribution).func,(Array2D<float> *)local_238);
  Array2D<float>::~Array2D((Array2D<float> *)local_238);
  Array2D<double>::~Array2D((Array2D<double> *)&vb);
  Array2D<float>::~Array2D(&local_68);
  Array2D<float>::~Array2D((Array2D<float> *)&va);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&channelDesc.offset)
  ;
  return;
}

Assistant:

PortalImageInfiniteLight::PortalImageInfiniteLight(
    const Transform &renderFromLight, Image equalAreaImage,
    const RGBColorSpace *imageColorSpace, Float scale, const std::string &filename,
    std::vector<Point3f> p, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(alloc),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      distribution(alloc) {
    ImageChannelDesc channelDesc = equalAreaImage.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for PortalImageInfiniteLight doesn't have R, "
                  "G, B channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());

    if (equalAreaImage.Resolution().x != equalAreaImage.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an equal area environment map.",
                  filename, equalAreaImage.Resolution().x, equalAreaImage.Resolution().y);

    if (p.size() != 4)
        ErrorExit("Expected 4 vertices for infinite light portal but given %d", p.size());
    for (int i = 0; i < 4; ++i)
        portal[i] = p[i];

    // PortalImageInfiniteLight constructor conclusion
    // Compute frame for portal coordinate system
    Vector3f p01 = Normalize(portal[1] - portal[0]);
    Vector3f p12 = Normalize(portal[2] - portal[1]);
    Vector3f p32 = Normalize(portal[2] - portal[3]);
    Vector3f p03 = Normalize(portal[3] - portal[0]);
    // Do opposite edges have the same direction?
    if (std::abs(Dot(p01, p32) - 1) > .001 || std::abs(Dot(p12, p03) - 1) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    // Sides perpendicular?
    if (std::abs(Dot(p01, p12)) > .001 || std::abs(Dot(p12, p32)) > .001 ||
        std::abs(Dot(p32, p03)) > .001 || std::abs(Dot(p03, p01)) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    portalFrame = Frame::FromXY(p03, p01);

    // Resample environment map into rectified image
    image = Image(PixelFormat::Float, equalAreaImage.Resolution(), {"R", "G", "B"},
                  equalAreaImage.Encoding(), alloc);
    ParallelFor(0, image.Resolution().y, [&](int y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            // Resample _equalAreaImage_ to compute rectified image pixel $(x,y)$
            // Find $(u,v)$ coordinates in equal-area image for pixel
            Point2f uv((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);
            Vector3f w = RenderFromImage(uv);
            w = Normalize(renderFromLight.ApplyInverse(w));
            Point2f uvEqui = EqualAreaSphereToSquare(w);

            for (int c = 0; c < 3; ++c) {
                Float v =
                    equalAreaImage.BilerpChannel(uvEqui, c, WrapMode::OctahedralSphere);
                image.SetChannel({x, y}, c, v);
            }
        }
    });

    // Initialize sampling distribution for portal image infinite light
    auto duv_dw = [&](const Point2f &p) {
        Float duv_dw;
        (void)RenderFromImage(p, &duv_dw);
        return duv_dw;
    };
    Array2D<Float> d = image.GetSamplingDistribution(duv_dw);
    distribution = WindowedPiecewiseConstant2D(d, alloc);
}